

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::MappingNode::increment(MappingNode *this)

{
  Token *pTVar1;
  KeyValueNode *this_00;
  char *Str;
  Twine TStack_108;
  Token T;
  Token local_b8;
  Token local_80;
  Token local_48;
  
  if ((*(char *)(*(long *)&((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                           stream->scanner + 0x4a) == '\x01') ||
     ((this->CurrentEntry != (KeyValueNode *)0x0 &&
      (KeyValueNode::skip(this->CurrentEntry), this->Type == MT_Inline)))) {
    this->IsAtEnd = true;
    this->CurrentEntry = (KeyValueNode *)0x0;
    return;
  }
  pTVar1 = Node::peekNext(&this->super_Node);
  Token::Token(&T,pTVar1);
  if ((T.Kind & ~TK_StreamEnd) == TK_Key) {
    this_00 = (KeyValueNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          NodeAllocator,0x58,0x10);
    KeyValueNode::KeyValueNode(this_00,(this->super_Node).Doc);
    this->CurrentEntry = this_00;
    goto LAB_001ad57c;
  }
  if (this->Type == MT_Block) {
    if (T.Kind != TK_Error) {
      if (T.Kind != TK_BlockEnd) {
        Str = "Unexpected token. Expected Key or Block End";
        goto LAB_001ad558;
      }
      Node::getNext(&local_48,&this->super_Node);
LAB_001ad541:
      std::__cxx11::string::_M_dispose();
    }
  }
  else if (T.Kind != TK_Error) {
    if (T.Kind == TK_FlowMappingEnd) {
      Node::getNext(&local_b8,&this->super_Node);
      goto LAB_001ad541;
    }
    if (T.Kind == TK_FlowEntry) {
      Node::getNext(&local_80,&this->super_Node);
      std::__cxx11::string::_M_dispose();
      increment(this);
      goto LAB_001ad57c;
    }
    Str = "Unexpected token. Expected Key, Flow Entry, or Flow Mapping End.";
LAB_001ad558:
    Twine::Twine(&TStack_108,Str);
    Node::setError(&this->super_Node,&TStack_108,&T);
  }
  this->IsAtEnd = true;
  this->CurrentEntry = (KeyValueNode *)0x0;
LAB_001ad57c:
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void MappingNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry) {
    CurrentEntry->skip();
    if (Type == MT_Inline) {
      IsAtEnd = true;
      CurrentEntry = nullptr;
      return;
    }
  }
  Token T = peekNext();
  if (T.Kind == Token::TK_Key || T.Kind == Token::TK_Scalar) {
    // KeyValueNode eats the TK_Key. That way it can detect null keys.
    CurrentEntry = new (getAllocator()) KeyValueNode(Doc);
  } else if (Type == MT_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError("Unexpected token. Expected Key or Block End", T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      return increment();
    case Token::TK_FlowMappingEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Key, Flow Entry, or Flow "
                "Mapping End."
              , T);
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  }
}